

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O3

REF_STATUS ref_adj_deep_copy(REF_ADJ *ref_adj_ptr,REF_ADJ original)

{
  int iVar1;
  uint uVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  REF_ADJ pRVar5;
  REF_INT *pRVar6;
  REF_ADJ_ITEM pRVar7;
  long lVar8;
  ulong uVar9;
  undefined8 uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  
  pRVar5 = (REF_ADJ)malloc(0x20);
  *ref_adj_ptr = pRVar5;
  if (pRVar5 == (REF_ADJ)0x0) {
    pcVar11 = "malloc *ref_adj_ptr of REF_ADJ_STRUCT NULL";
    uVar10 = 0x3f;
  }
  else {
    iVar1 = original->nnode;
    lVar12 = (long)iVar1;
    pRVar5->nnode = iVar1;
    uVar2 = original->nitem;
    uVar13 = (ulong)uVar2;
    pRVar5->nitem = uVar2;
    if (lVar12 < 0) {
      pcVar11 = "malloc ref_adj->first of REF_INT negative";
      uVar10 = 0x45;
LAB_001c0a7f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",uVar10,
             "ref_adj_deep_copy",pcVar11);
      return 1;
    }
    pRVar6 = (REF_INT *)malloc(lVar12 * 4);
    pRVar5->first = pRVar6;
    if (pRVar6 == (REF_INT *)0x0) {
      pcVar11 = "malloc ref_adj->first of REF_INT NULL";
      uVar10 = 0x45;
    }
    else {
      if (iVar1 != 0) {
        pRVar3 = original->first;
        lVar8 = 0;
        do {
          pRVar6[lVar8] = pRVar3[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar12 != lVar8);
      }
      if ((int)uVar2 < 0) {
        pcVar11 = "malloc ref_adj->item of REF_ADJ_ITEM_STRUCT negative";
        uVar10 = 0x49;
        goto LAB_001c0a7f;
      }
      pRVar7 = (REF_ADJ_ITEM)malloc(uVar13 * 8);
      pRVar5->item = pRVar7;
      if (pRVar7 != (REF_ADJ_ITEM)0x0) {
        if (uVar13 != 0) {
          pRVar4 = original->item;
          uVar9 = 0;
          do {
            pRVar7[uVar9] = pRVar4[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        pRVar5->blank = original->blank;
        return 0;
      }
      pcVar11 = "malloc ref_adj->item of REF_ADJ_ITEM_STRUCT NULL";
      uVar10 = 0x49;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",uVar10,
         "ref_adj_deep_copy",pcVar11);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_adj_deep_copy(REF_ADJ *ref_adj_ptr, REF_ADJ original) {
  REF_ADJ ref_adj;
  REF_INT i;

  ref_malloc(*ref_adj_ptr, 1, REF_ADJ_STRUCT);
  ref_adj = (*ref_adj_ptr);

  ref_adj_nnode(ref_adj) = ref_adj_nnode(original);
  ref_adj_nitem(ref_adj) = ref_adj_nitem(original);

  ref_malloc(ref_adj->first, ref_adj_nnode(ref_adj), REF_INT);
  for (i = 0; i < ref_adj_nnode(ref_adj); i++)
    ref_adj->first[i] = original->first[i];

  ref_malloc(ref_adj->item, ref_adj_nitem(ref_adj), REF_ADJ_ITEM_STRUCT);
  for (i = 0; i < ref_adj_nitem(ref_adj); i++) {
    ref_adj->item[i].ref = original->item[i].ref;
    ref_adj->item[i].next = original->item[i].next;
  }
  ref_adj->blank = original->blank;

  return REF_SUCCESS;
}